

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_DP2ADD(Context *ctx)

{
  int iVar1;
  int iVar2;
  size_t in_RCX;
  size_t in_RDX;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char scratch [64];
  char acStack_158 [64];
  char local_118 [64];
  char local_d8 [64];
  char local_98 [64];
  char local_58 [72];
  
  if (ctx->profile_supports_nv4 != 0) {
    emit_ARB1_opcode_dsss(ctx,"DP2A");
    return;
  }
  make_ARB1_destarg_string(ctx,local_98,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_d8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_118,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,acStack_158,in_RCX);
  iVar1 = ctx->scratch_registers;
  iVar2 = iVar1 + 1;
  ctx->scratch_registers = iVar2;
  if (ctx->max_scratch_registers <= iVar1) {
    ctx->max_scratch_registers = iVar2;
  }
  snprintf(local_58,0x40,"scratch%d");
  output_line(ctx,"MUL %s, %s, %s;",local_58,local_d8,local_118);
  output_line(ctx,"ADD %s, %s.x, %s.y;",local_58,local_58,local_58);
  output_line(ctx,"ADD%s, %s.x, %s;",local_98,local_58,acStack_158);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(BEM)


static void emit_ARB1_DP2ADD(Context *ctx)
{
    if (support_nv4(ctx))  // nv4 has a built-in equivalent to DP2ADD.
        emit_ARB1_opcode_dsss(ctx, "DP2A");
    else
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
        char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
        char scratch[64];

        // DP2ADD is:
        //  dst = (src0.r * src1.r) + (src0.g * src1.g) + src2.replicate_swiz
        allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));
        output_line(ctx, "MUL %s, %s, %s;", scratch, src0, src1);
        output_line(ctx, "ADD %s, %s.x, %s.y;", scratch, scratch, scratch);
        output_line(ctx, "ADD%s, %s.x, %s;", dst, scratch, src2);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}